

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

void __thiscall nivalis::Plotter::begin_slider_animation(Plotter *this,size_t idx)

{
  rep rVar1;
  pointer pSVar2;
  iterator __position;
  size_t local_20;
  
  pSVar2 = (this->sliders).
           super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar2[idx].animation_dir == 0) {
    __position._M_current =
         (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_20 = idx;
    if ((this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start == __position._M_current) {
      rVar1 = std::chrono::_V2::system_clock::now();
      (this->slider_animation_prev_time).__d.__r = rVar1;
      pSVar2 = (this->sliders).
               super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>._M_impl
               .super__Vector_impl_data._M_start;
      __position._M_current =
           (this->animating_sliders).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    pSVar2[idx].animation_dir = 1;
    if (__position._M_current ==
        (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->animating_sliders,
                 __position,&local_20);
    }
    else {
      *__position._M_current = idx;
      (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->require_update = true;
  }
  return;
}

Assistant:

void Plotter::begin_slider_animation(size_t idx) {
    if (sliders[idx].animation_dir == 0) {
        if (animating_sliders.empty()) {
            slider_animation_prev_time =
                std::chrono::high_resolution_clock::now();
        }
        sliders[idx].animation_dir = 1;
        animating_sliders.push_back(idx);
        require_update = true;
    }
}